

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateJSType
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  char *pcVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  string_view element_name;
  string_view element_name_00;
  JSType jstype;
  uint local_1c;
  VoidPtr local_18;
  code *pcStack_10;
  uint *local_8;
  
  local_1c = (field->options_->field_0)._impl_.jstype_;
  if (local_1c != 0) {
    if ((0x12 < field->type_) || ((0x50058U >> (field->type_ & 0x1f) & 1) == 0)) {
      pcVar1 = (field->all_names_).payload_;
      element_name_00._M_len = (ulong)*(ushort *)(pcVar1 + 2);
      element_name_00._M_str = pcVar1 + ~element_name_00._M_len;
      AddError(this,element_name_00,&proto->super_Message,TYPE,
               "jstype is only allowed on int64, uint64, sint64, fixed64 or sfixed64 fields.");
      return;
    }
    if (2 < local_1c) {
      pcVar1 = (field->all_names_).payload_;
      element_name._M_len = (ulong)*(ushort *)(pcVar1 + 2);
      element_name._M_str = pcVar1 + ~element_name._M_len;
      local_8 = &local_1c;
      local_18.obj = &local_8;
      pcStack_10 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::ValidateJSType(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
      ;
      make_error.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::ValidateJSType(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
      ;
      make_error.ptr_.obj = local_18.obj;
      AddError(this,element_name,&proto->super_Message,TYPE,make_error);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateJSType(const FieldDescriptor* field,
                                       const FieldDescriptorProto& proto) {
  FieldOptions::JSType jstype = field->options().jstype();
  // The default is always acceptable.
  if (jstype == FieldOptions::JS_NORMAL) {
    return;
  }

  switch (field->type()) {
    // Integral 64-bit types may be represented as JavaScript numbers or
    // strings.
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED64:
      if (jstype == FieldOptions::JS_STRING ||
          jstype == FieldOptions::JS_NUMBER) {
        return;
      }
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               [&] {
                 return absl::StrCat(
                     "Illegal jstype for int64, uint64, sint64, fixed64 "
                     "or sfixed64 field: ",
                     FieldOptions_JSType_descriptor()->value(jstype)->name());
               });
      break;

    // No other types permit a jstype option.
    default:
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "jstype is only allowed on int64, uint64, sint64, fixed64 "
               "or sfixed64 fields.");
      break;
  }
}